

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGL3DriverBase::draw2DRectangle
          (COpenGL3DriverBase *this,rect<int> *position,SColor colorLeftUp,SColor colorRightUp,
          SColor colorLeftDown,SColor colorRightDown,rect<int> *clip)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auStack_e4 [8];
  undefined1 auStack_dc [4];
  rect<int> local_d8;
  float local_c8;
  float local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  u32 local_b0;
  undefined8 local_ac;
  float local_a4;
  float local_a0;
  undefined8 local_9c;
  undefined8 uStack_94;
  u32 local_8c;
  undefined8 local_88;
  float local_80;
  float local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  u32 local_68;
  undefined8 local_64;
  float local_5c;
  float local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  u32 local_44;
  undefined8 local_40;
  
  local_d8.UpperLeftCorner = position->UpperLeftCorner;
  local_d8.LowerRightCorner = position->LowerRightCorner;
  if (clip != (rect<int> *)0x0) {
    stack0xffffffffffffff20 = 0x1f3349;
    core::rect<int>::clipAgainst(&local_d8,clip);
  }
  if ((local_d8.UpperLeftCorner.X <= local_d8.LowerRightCorner.X) &&
     (local_d8.UpperLeftCorner.Y <= local_d8.LowerRightCorner.Y)) {
    stack0xffffffffffffff20 = 0x1f336c;
    chooseMaterial2D(this);
    (this->Material).TextureLayers[0].Texture = (ITexture *)0x0;
    stack0xffffffffffffff20 = 0x1f3392;
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set(&this->CacheHandler->TextureCache,0,(ITexture *)0x0,EST_ACTIVE_ALWAYS);
    stack0xffffffffffffff20 = 0x1f33c2;
    setRenderStates2DMode
              (this,(colorRightDown.color < 0xff000000 || colorLeftDown.color < 0xff000000) ||
                    (colorRightUp.color < 0xff000000 || colorLeftUp.color < 0xff000000),false,false)
    ;
    stack0xffffffffffffff20 = 0x1f33cf;
    iVar1 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])();
    fVar4 = (float)*(uint *)CONCAT44(extraout_var,iVar1);
    fVar3 = (float)local_d8.UpperLeftCorner.X / fVar4;
    fVar4 = (float)local_d8.LowerRightCorner.X / fVar4;
    fVar6 = (float)((uint *)CONCAT44(extraout_var,iVar1))[1];
    fVar5 = (float)local_d8.LowerRightCorner.Y / fVar6;
    fVar6 = (float)local_d8.UpperLeftCorner.Y / fVar6;
    lVar2 = 0x1c;
    do {
      *(undefined8 *)(auStack_e4 + lVar2) = 0;
      *(undefined8 *)(auStack_dc + lVar2) = 0;
      *(undefined8 *)((long)&local_d8.UpperLeftCorner.Y + lVar2) = 0;
      *(undefined4 *)((long)&local_d8.LowerRightCorner.Y + lVar2) = 0xffffffff;
      *(undefined8 *)((long)&local_c8 + lVar2) = 0;
      lVar2 = lVar2 + 0x24;
    } while (lVar2 != 0xac);
    local_c8 = fVar3 + fVar3 + -1.0;
    local_a4 = fVar4 + fVar4 + -1.0;
    local_7c = (2.0 - (fVar5 + fVar5)) + -1.0;
    local_c4 = (2.0 - (fVar6 + fVar6)) + -1.0;
    local_c0 = 0;
    uStack_b8 = 0x3f80000000000000;
    local_ac = 0;
    local_9c = 0;
    uStack_94 = 0x3f80000000000000;
    local_88 = 0;
    local_78 = 0;
    uStack_70 = 0x3f80000000000000;
    local_64 = 0;
    local_54 = 0;
    uStack_4c = 0x3f80000000000000;
    local_40 = 0;
    stack0xffffffffffffff20 = 0x1f34f1;
    local_b0 = colorLeftUp.color;
    local_a0 = local_c4;
    local_8c = colorRightUp.color;
    local_80 = local_a4;
    local_68 = colorRightDown.color;
    local_5c = local_c8;
    local_58 = local_7c;
    local_44 = colorLeftDown.color;
    drawArrays(this,6,(VertexType *)vtPrimitive,&local_c8,4);
  }
  return;
}

Assistant:

void COpenGL3DriverBase::draw2DRectangle(const core::rect<s32> &position,
		SColor colorLeftUp, SColor colorRightUp,
		SColor colorLeftDown, SColor colorRightDown,
		const core::rect<s32> *clip)
{
	core::rect<s32> pos = position;

	if (clip)
		pos.clipAgainst(*clip);

	if (!pos.isValid())
		return;

	chooseMaterial2D();
	setMaterialTexture(0, 0);

	setRenderStates2DMode(colorLeftUp.getAlpha() < 255 ||
								  colorRightUp.getAlpha() < 255 ||
								  colorLeftDown.getAlpha() < 255 ||
								  colorRightDown.getAlpha() < 255,
			false, false);

	const core::dimension2d<u32> &renderTargetSize = getCurrentRenderTargetSize();

	f32 left = (f32)pos.UpperLeftCorner.X / (f32)renderTargetSize.Width * 2.f - 1.f;
	f32 right = (f32)pos.LowerRightCorner.X / (f32)renderTargetSize.Width * 2.f - 1.f;
	f32 down = 2.f - (f32)pos.LowerRightCorner.Y / (f32)renderTargetSize.Height * 2.f - 1.f;
	f32 top = 2.f - (f32)pos.UpperLeftCorner.Y / (f32)renderTargetSize.Height * 2.f - 1.f;

	S3DVertex vertices[4];
	vertices[0] = S3DVertex(left, top, 0, 0, 0, 1, colorLeftUp, 0, 0);
	vertices[1] = S3DVertex(right, top, 0, 0, 0, 1, colorRightUp, 0, 0);
	vertices[2] = S3DVertex(right, down, 0, 0, 0, 1, colorRightDown, 0, 0);
	vertices[3] = S3DVertex(left, down, 0, 0, 0, 1, colorLeftDown, 0, 0);

	drawQuad(vtPrimitive, vertices);
}